

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NN.cpp
# Opt level: O1

void __thiscall NN::addOpAdd_Mat(NN *this,int res,int a,int b)

{
  pointer ppNVar1;
  Add_Mat *this_00;
  
  addedge(this,a,res);
  addedge(this,b,res);
  this_00 = (Add_Mat *)operator_new(0x38);
  ppNVar1 = (this->neuron).super__Vector_base<NeuronMat_*,_std::allocator<NeuronMat_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  MathOp::Add_Mat::Add_Mat(this_00,ppNVar1[res],ppNVar1[a],ppNVar1[b]);
  NeuronMat::setOp((this->neuron).super__Vector_base<NeuronMat_*,_std::allocator<NeuronMat_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[res],(Op *)this_00);
  return;
}

Assistant:

void NN::addOpAdd_Mat(int res, int a, int b) {
    addedge(a, res);
    addedge(b, res);
    setOp(res, new MathOp::Add_Mat(getNeuron(res), getNeuron(a), getNeuron(b)));
}